

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.cxx
# Opt level: O1

void __thiscall cmCMakePath::GetNativePath(cmCMakePath *this,wstring *path)

{
  allocator<wchar_t> *in_R8;
  basic_string_view<char,_std::char_traits<char>_> __str;
  path tmp;
  char local_59;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_58;
  path local_38;
  
  std::filesystem::__cxx11::path::path(&local_38,&this->Path);
  __str._M_str = &local_59;
  __str._M_len = (size_t)local_38._M_pathname._M_dataplus._M_p;
  std::filesystem::__cxx11::path::
  _S_str_convert<wchar_t,std::char_traits<wchar_t>,std::allocator<wchar_t>>
            (&local_58,(path *)local_38._M_pathname._M_string_length,__str,in_R8);
  std::__cxx11::wstring::operator=((wstring *)path,(wstring *)&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity * 4 + 4);
  }
  std::filesystem::__cxx11::path::~path(&local_38);
  return;
}

Assistant:

void cmCMakePath::GetNativePath(std::wstring& path) const
{
  cm::filesystem::path tmp(this->Path);
  tmp.make_preferred();

  path = tmp.wstring();

#if defined(_WIN32)
  // Windows long filename
  static std::wstring UNC(L"\\\\?\\UNC");
  static std::wstring PREFIX(L"\\\\?\\");

  if (this->IsAbsolute() && path.length() > _MAX_PATH - 12) {
    if (this->HasRootName() && path[0] == L'\\') {
      path = UNC + path.substr(1);
    } else {
      path = PREFIX + path;
    }
  }
#endif
}